

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O2

void __thiscall
lsim::LSimContext::load_reference_library(LSimContext *this,char *name,char *filename)

{
  __uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_> _Var1;
  bool bVar2;
  iterator iVar3;
  __uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
  *this_00;
  __single_object lib;
  allocator local_81;
  __uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
  local_80;
  key_type local_78;
  char *local_58;
  char *local_50;
  string local_48;
  
  local_58 = name;
  local_50 = filename;
  std::__cxx11::string::string((string *)&local_78,name,(allocator *)&local_48);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_reference_libraries)._M_h,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::make_unique<lsim::ModelCircuitLibrary,char_const*&,char_const*&>
              ((char **)&local_80,&local_58);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
    .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl =
         local_80._M_t.
         super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
         .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_48,local_50,&local_81);
    full_file_path(&local_78,this,&local_48);
    bVar2 = deserialize_library(this,(ModelCircuitLibrary *)
                                     _Var1._M_t.
                                     super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
                                     .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>.
                                     _M_head_impl,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_78,local_58,(allocator *)&local_48);
      this_00 = (__uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                 *)std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->m_reference_libraries,&local_78);
      _Var1._M_t.
      super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
      .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl =
           local_80._M_t.
           super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
           .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl;
      local_80._M_t.
      super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
      .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl =
           (tuple<lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>)
           (_Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
            )0x0;
      std::
      __uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
      reset(this_00,(pointer)_Var1._M_t.
                             super__Tuple_impl<0UL,_lsim::ModelCircuitLibrary_*,_std::default_delete<lsim::ModelCircuitLibrary>_>
                             .super__Head_base<0UL,_lsim::ModelCircuitLibrary_*,_false>._M_head_impl
           );
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      std::
      __uniq_ptr_impl<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
      reset(&local_80,(pointer)0x0);
    }
    std::unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>::
    ~unique_ptr((unique_ptr<lsim::ModelCircuitLibrary,_std::default_delete<lsim::ModelCircuitLibrary>_>
                 *)&local_80);
  }
  return;
}

Assistant:

void LSimContext::load_reference_library(const char *name, const char *filename) {
    if (m_reference_libraries.find(name) != m_reference_libraries.end()) {
        return;
    }

    auto lib = std::make_unique<ModelCircuitLibrary>(name, filename);
    if (!deserialize_library(this, lib.get(), full_file_path(filename).c_str())) {
        lib = nullptr;
        return;
    }

    m_reference_libraries[name] = std::move(lib);
}